

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d57_q2_heap_order2.cpp
# Opt level: O0

void __thiscall
CP::priority_queue<student,_std::less<student>_>::fixDown
          (priority_queue<student,_std::less<student>_> *this,size_t idx)

{
  bool bVar1;
  long lVar2;
  pointer local_58;
  size_t c;
  student tmp;
  size_t idx_local;
  priority_queue<student,_std::less<student>_> *this_local;
  
  tmp.scores.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)idx;
  student::student((student *)&c,this->mData + idx);
  while( true ) {
    lVar2 = (long)tmp.scores.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage * 2;
    local_58 = (pointer)(lVar2 + 1);
    if ((pointer)this->mSize <= local_58) break;
    if ((lVar2 + 2U < this->mSize) &&
       (bVar1 = std::less<student>::operator()
                          ((less<student> *)&this->field_0x18,this->mData + (long)local_58,
                           this->mData + lVar2 + 2), bVar1)) {
      local_58 = (pointer)(lVar2 + 2);
    }
    bVar1 = std::less<student>::operator()
                      ((less<student> *)&this->field_0x18,this->mData + (long)local_58,(student *)&c
                      );
    if (bVar1) break;
    student::operator=(this->mData +
                       (long)tmp.scores.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,this->mData + (long)local_58)
    ;
    tmp.scores.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = local_58;
  }
  student::operator=(this->mData +
                     (long)tmp.scores.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(student *)&c);
  student::~student((student *)&c);
  return;
}

Assistant:

void fixDown(size_t idx) {
      T tmp = mData[idx];
      size_t c;
      while ((c = 2 * idx + 1) < mSize) {
        if (c + 1 < mSize && mLess(mData[c],mData[c + 1]) ) c++;
        if ( mLess(mData[c],tmp) ) break;
        mData[idx] = mData[c];
        idx = c;
      }
      mData[idx] = tmp;
    }